

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O1

void __thiscall
RigidBodyDynamics::Errors::RBDLInvalidParameterError::~RBDLInvalidParameterError
          (RBDLInvalidParameterError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_RBDLError = &PTR__RBDLError_001988f0;
  pcVar2 = (this->super_RBDLError).text._M_dataplus._M_p;
  paVar1 = &(this->super_RBDLError).text.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLInvalidParameterError : public RBDLError
{
public:
  RBDLInvalidParameterError(std::string text);
}